

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManFindOneUnate(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t **vUnateLits,
                       Vec_Int_t **vNotUnateVars,int fVerbose)

{
  int iVar1;
  ulong uVar2;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  Vec_Ptr_t *pOn;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)nWords;
  pOn = vDivs;
  if (fVerbose != 0) {
    printf("  ");
    uVar2 = extraout_RDX;
  }
  for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
    Gia_ManFindOneUnateInt
              (pSets[uVar3],(word *)pOn,vDivs,nWords,vUnateLits[uVar3],vNotUnateVars[uVar3]);
    uVar2 = extraout_RDX_00;
    if (fVerbose != 0) {
      pOn = (Vec_Ptr_t *)(uVar3 & 0xffffffff);
      printf("U%d =%4d ",pOn,(ulong)(uint)vUnateLits[uVar3]->nSize);
      uVar2 = extraout_RDX_01;
    }
  }
  iVar1 = Gia_ManFindFirstCommonLit(*vUnateLits,vUnateLits[1],(int)uVar2);
  return iVar1;
}

Assistant:

int Gia_ManFindOneUnate( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits[2], Vec_Int_t * vNotUnateVars[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFindOneUnateInt( pSets[n], pSets[!n], vDivs, nWords, vUnateLits[n], vNotUnateVars[n] );
        if ( fVerbose ) printf( "U%d =%4d ", n, Vec_IntSize(vUnateLits[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnateLits[0], vUnateLits[1], fVerbose );
}